

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_sse2.c
# Opt level: O0

void convolve_2d_sr_12tap_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  undefined8 *puVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint7 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  uint uVar74;
  int iVar75;
  long lVar76;
  int in_ECX;
  long lVar77;
  int iVar78;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  __m128i *p;
  __m128i res_12;
  __m128i res16;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i res_hi;
  __m128i res_lo;
  __m128i res_odd_1;
  __m128i res_1357_1;
  __m128i res_11_1;
  __m128i res_9_1;
  __m128i res_7_1;
  __m128i res_5_1;
  __m128i res_3_1;
  __m128i res_1_1;
  __m128i src_11_1;
  __m128i src_9_1;
  __m128i src_7_1;
  __m128i src_5_1;
  __m128i src_3_1;
  __m128i src_1_1;
  __m128i res_even_1;
  __m128i res_0246_1;
  __m128i res_10_1;
  __m128i res_8_1;
  __m128i res_6_1;
  __m128i res_4_1;
  __m128i res_2_1;
  __m128i res_0_1;
  __m128i src_10_1;
  __m128i src_8_1;
  __m128i src_6_1;
  __m128i src_4_1;
  __m128i src_2_1;
  __m128i src_0_1;
  int16_t *data_1;
  __m128i round_shift_1;
  __m128i round_const_1;
  __m128i sum_shift;
  __m128i sum_round;
  __m128i res;
  __m128i res_odd;
  __m128i res_1357;
  __m128i res_11;
  __m128i src_11;
  __m128i res_9;
  __m128i src_9;
  __m128i res_7;
  __m128i src_7;
  __m128i res_5;
  __m128i src_5;
  __m128i res_3;
  __m128i src_3;
  __m128i res_1;
  __m128i src_1;
  __m128i res_even;
  __m128i res_0246;
  __m128i res_10;
  __m128i src_10;
  __m128i res_8;
  __m128i src_8;
  __m128i res_6;
  __m128i src_6;
  __m128i res_4;
  __m128i src_4;
  __m128i res_2;
  __m128i src_2;
  __m128i res_0;
  __m128i src_0;
  __m128i data_2;
  __m128i data;
  __m128i round_shift;
  __m128i round_const;
  __m128i coeffs [6];
  int offset_bits;
  int bits;
  __m128i zero;
  uint8_t *src_ptr;
  int fo_horiz;
  int fo_vert;
  int j;
  int i;
  int im_stride;
  int im_h;
  int16_t im_block [17792];
  int bd;
  undefined1 in_stack_ffffffffffff63e0;
  undefined1 in_stack_ffffffffffff63e1;
  undefined1 in_stack_ffffffffffff63e2;
  undefined1 in_stack_ffffffffffff63e3;
  undefined1 in_stack_ffffffffffff63e4;
  undefined1 in_stack_ffffffffffff63e5;
  undefined1 in_stack_ffffffffffff63e6;
  undefined1 in_stack_ffffffffffff63e7;
  undefined1 in_stack_ffffffffffff63e8 [16];
  undefined1 auVar93 [12];
  undefined8 local_99b8;
  undefined8 uStack_99b0;
  undefined8 local_9988;
  undefined8 uStack_9980;
  undefined8 local_9968;
  undefined8 uStack_9960;
  undefined8 local_9948;
  undefined8 uStack_9940;
  undefined8 local_9928;
  undefined8 uStack_9920;
  undefined8 local_9908;
  undefined8 uStack_9900;
  undefined8 local_98e8;
  undefined8 uStack_98e0;
  undefined8 local_98a8;
  undefined8 uStack_98a0;
  undefined8 local_9888;
  undefined8 uStack_9880;
  undefined8 local_9868;
  undefined8 uStack_9860;
  undefined8 local_9848;
  undefined8 uStack_9840;
  undefined8 local_9828;
  undefined8 uStack_9820;
  undefined8 local_9808;
  undefined8 uStack_9800;
  undefined8 local_97a8;
  undefined8 uStack_97a0;
  undefined8 local_9798;
  undefined8 uStack_9790;
  undefined8 local_9788;
  undefined8 uStack_9780;
  undefined8 local_9778;
  undefined8 uStack_9770;
  undefined8 local_9768;
  undefined8 uStack_9760;
  undefined8 local_9758;
  undefined8 uStack_9750;
  byte local_9740;
  byte local_973c;
  int local_9718;
  int local_9714;
  undefined8 local_9708 [4449];
  undefined4 local_c00;
  int local_bfc;
  int local_bf8;
  int local_bf4;
  long local_bf0;
  int local_be4;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined1 (*local_bc8) [16];
  undefined1 (*local_bc0) [16];
  int local_b6c;
  ulong local_b68;
  ulong local_b48;
  undefined1 local_b28 [16];
  uint local_b0c;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined1 local_af8 [16];
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined1 local_ad8 [16];
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined1 local_ab8 [16];
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined1 local_a98 [16];
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined1 local_a78 [16];
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined1 local_a58 [16];
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined1 local_a38 [16];
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined1 local_a18 [16];
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined1 local_9f8 [16];
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined1 local_9b8 [16];
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  ulong local_7f8;
  ulong uStack_7f0;
  ulong local_7d8;
  ulong uStack_7d0;
  ulong local_7b8;
  ulong uStack_7b0;
  ulong local_798;
  ulong uStack_790;
  ulong local_778;
  ulong uStack_770;
  ulong local_758;
  ulong uStack_750;
  ulong local_738;
  ulong uStack_730;
  ulong local_718;
  ulong uStack_710;
  ulong local_6f8;
  ulong uStack_6f0;
  ulong local_6d8;
  ulong uStack_6d0;
  ulong local_6b8;
  ulong uStack_6b0;
  ulong local_698;
  ulong uStack_690;
  int iStack_65c;
  int local_5e8;
  int iStack_5e4;
  int iStack_5e0;
  int iStack_5dc;
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  int local_5a8;
  int iStack_5a4;
  int iStack_5a0;
  int iStack_59c;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  int local_588;
  int iStack_584;
  int iStack_580;
  int iStack_57c;
  int local_578;
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  int local_548;
  int iStack_544;
  int iStack_540;
  int iStack_53c;
  int local_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int local_508;
  int iStack_504;
  int iStack_500;
  int iStack_4fc;
  int local_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  int local_4e8;
  int iStack_4e4;
  int iStack_4e0;
  int iStack_4dc;
  int local_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  int local_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  int local_468;
  int iStack_464;
  int iStack_460;
  int iStack_45c;
  int local_458;
  int iStack_454;
  int iStack_450;
  int iStack_44c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  int local_3a8;
  int iStack_3a4;
  int iStack_3a0;
  int iStack_39c;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  ulong local_2c8;
  undefined8 uStack_2c0;
  int local_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  ulong local_2a8;
  undefined8 uStack_2a0;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_230;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 local_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined2 uStack_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined2 local_4;
  undefined2 uStack_2;
  
  auVar93 = in_stack_ffffffffffff63e8._4_12_;
  local_c00 = 8;
  uVar2 = *(ushort *)(res_12[0] + 8);
  lVar76 = (in_RDI - (int)(((*(ushort *)(res_12[0] + 8) >> 1) - 1) * in_ESI)) -
           (long)(int)((ushort)((ushort)(*p)[1] >> 1) - 1);
  local_bd8 = 0;
  uStack_bd0 = 0;
  uVar74 = 0xe - (*(int *)(res16[1] + 0x14) + *(int *)(res16[1] + 0x18));
  local_9740 = 0x16 - (char)*(undefined4 *)(res16[1] + 0x14);
  local_bfc = in_R9D;
  local_bf8 = in_R8D;
  local_bf4 = in_ECX;
  local_bf0 = in_RDX;
  local_be4 = in_ESI;
  prepare_coeffs_12tap
            (in_stack_ffffffffffff63e8._8_8_,in_stack_ffffffffffff63e8._4_4_,
             (__m128i *)
             CONCAT17(in_stack_ffffffffffff63e7,
                      CONCAT16(in_stack_ffffffffffff63e6,
                               CONCAT15(in_stack_ffffffffffff63e5,
                                        CONCAT14(in_stack_ffffffffffff63e4,
                                                 CONCAT13(in_stack_ffffffffffff63e3,
                                                          CONCAT12(in_stack_ffffffffffff63e2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffff63e1,
                                                  in_stack_ffffffffffff63e0))))))));
  local_b6c = ((1 << (*(byte *)(res16[1] + 0x14) & 0x1f)) >> 1) + 0x4000;
  local_68 = CONCAT44(local_b6c,local_b6c);
  uStack_60 = CONCAT44(local_b6c,local_b6c);
  local_b0c = *(uint *)(res16[1] + 0x14);
  local_b28._4_4_ = 0;
  local_b28._0_4_ = local_b0c;
  for (local_9714 = 0; local_9714 < (int)(in_R9D + -1 + (uint)uVar2); local_9714 = local_9714 + 1) {
    for (local_9718 = 0; local_9718 < local_bf8; local_9718 = local_9718 + 8) {
      local_bc0 = (undefined1 (*) [16])(lVar76 + (local_9714 * local_be4 + local_9718));
      uVar3 = *(undefined8 *)*local_bc0;
      uStack_990 = *(undefined8 *)(*local_bc0 + 8);
      auVar90 = *local_bc0;
      auVar89 = *local_bc0;
      auVar85 = *local_bc0;
      local_bc8 = (undefined1 (*) [16])(lVar76 + (local_9718 + 4 + local_9714 * local_be4));
      uVar4 = *(undefined8 *)*local_bc8;
      uStack_9d0 = *(undefined8 *)(*local_bc8 + 8);
      auVar7 = *local_bc8;
      auVar91 = *local_bc8;
      auVar6 = *local_bc8;
      auVar92 = *local_bc8;
      auVar88 = *local_bc8;
      auVar87 = *local_bc8;
      auVar86 = *local_bc8;
      local_9a8 = 0;
      uStack_9a0 = 0;
      local_998._0_1_ = (byte)uVar3;
      local_998._1_1_ = (undefined1)((ulong)uVar3 >> 8);
      local_998._2_1_ = (undefined1)((ulong)uVar3 >> 0x10);
      local_998._3_1_ = (undefined1)((ulong)uVar3 >> 0x18);
      local_998._4_1_ = (byte)((ulong)uVar3 >> 0x20);
      local_998._5_1_ = (undefined1)((ulong)uVar3 >> 0x28);
      local_998._6_1_ = (undefined1)((ulong)uVar3 >> 0x30);
      local_998._7_1_ = (undefined1)((ulong)uVar3 >> 0x38);
      local_698 = CONCAT17(0,CONCAT16(local_998._3_1_,
                                      (uint6)CONCAT14(local_998._2_1_,
                                                      (uint)CONCAT12(local_998._1_1_,
                                                                     (ushort)(byte)local_998))));
      uVar5 = CONCAT16(local_998._7_1_,
                       (uint6)CONCAT14(local_998._6_1_,
                                       (uint)CONCAT12(local_998._5_1_,(ushort)local_998._4_1_)));
      uStack_690 = (ulong)uVar5;
      auVar39._8_7_ = uVar5;
      auVar39._0_8_ = local_698;
      auVar39[0xf] = 0;
      auVar38._8_8_ = uStack_97a0;
      auVar38._0_8_ = local_97a8;
      auVar79 = pmaddwd(auVar39,auVar38);
      local_9c8 = 0;
      uStack_9c0 = 0;
      local_9b8[0] = auVar85[2];
      local_9b8[1] = auVar85[3];
      local_9b8[2] = auVar85[4];
      local_9b8[3] = auVar85[5];
      local_9b8[4] = auVar85[6];
      local_9b8[5] = auVar85[7];
      local_9b8[6] = auVar85[8];
      local_9b8[7] = auVar85[9];
      local_6b8 = CONCAT17(0,CONCAT16(local_9b8[3],
                                      (uint6)CONCAT14(local_9b8[2],
                                                      (uint)CONCAT12(local_9b8[1],
                                                                     (ushort)local_9b8[0]))));
      uVar5 = CONCAT16(local_9b8[7],
                       (uint6)CONCAT14(local_9b8[6],
                                       (uint)CONCAT12(local_9b8[5],(ushort)local_9b8[4])));
      uStack_6b0 = (ulong)uVar5;
      auVar37._8_7_ = uVar5;
      auVar37._0_8_ = local_6b8;
      auVar37[0xf] = 0;
      auVar36._8_8_ = uStack_9790;
      auVar36._0_8_ = local_9798;
      auVar80 = pmaddwd(auVar37,auVar36);
      local_9e8 = 0;
      uStack_9e0 = 0;
      local_9d8._0_1_ = (byte)uVar4;
      local_9d8._1_1_ = (undefined1)((ulong)uVar4 >> 8);
      local_9d8._2_1_ = (undefined1)((ulong)uVar4 >> 0x10);
      local_9d8._3_1_ = (undefined1)((ulong)uVar4 >> 0x18);
      local_9d8._4_1_ = (byte)((ulong)uVar4 >> 0x20);
      local_9d8._5_1_ = (undefined1)((ulong)uVar4 >> 0x28);
      local_9d8._6_1_ = (undefined1)((ulong)uVar4 >> 0x30);
      local_9d8._7_1_ = (undefined1)((ulong)uVar4 >> 0x38);
      local_6d8 = CONCAT17(0,CONCAT16(local_9d8._3_1_,
                                      (uint6)CONCAT14(local_9d8._2_1_,
                                                      (uint)CONCAT12(local_9d8._1_1_,
                                                                     (ushort)(byte)local_9d8))));
      uVar5 = CONCAT16(local_9d8._7_1_,
                       (uint6)CONCAT14(local_9d8._6_1_,
                                       (uint)CONCAT12(local_9d8._5_1_,(ushort)local_9d8._4_1_)));
      uStack_6d0 = (ulong)uVar5;
      auVar35._8_7_ = uVar5;
      auVar35._0_8_ = local_6d8;
      auVar35[0xf] = 0;
      auVar34._8_8_ = uStack_9780;
      auVar34._0_8_ = local_9788;
      auVar81 = pmaddwd(auVar35,auVar34);
      local_a08 = 0;
      uStack_a00 = 0;
      local_9f8[0] = auVar86[2];
      local_9f8[1] = auVar86[3];
      local_9f8[2] = auVar86[4];
      local_9f8[3] = auVar86[5];
      local_9f8[4] = auVar86[6];
      local_9f8[5] = auVar86[7];
      local_9f8[6] = auVar86[8];
      local_9f8[7] = auVar86[9];
      local_6f8 = CONCAT17(0,CONCAT16(local_9f8[3],
                                      (uint6)CONCAT14(local_9f8[2],
                                                      (uint)CONCAT12(local_9f8[1],
                                                                     (ushort)local_9f8[0]))));
      uVar5 = CONCAT16(local_9f8[7],
                       (uint6)CONCAT14(local_9f8[6],
                                       (uint)CONCAT12(local_9f8[5],(ushort)local_9f8[4])));
      uStack_6f0 = (ulong)uVar5;
      auVar33._8_7_ = uVar5;
      auVar33._0_8_ = local_6f8;
      auVar33[0xf] = 0;
      auVar32._8_8_ = uStack_9770;
      auVar32._0_8_ = local_9778;
      auVar82 = pmaddwd(auVar33,auVar32);
      local_a28 = 0;
      uStack_a20 = 0;
      local_a18[0] = auVar87[4];
      local_a18[1] = auVar87[5];
      local_a18[2] = auVar87[6];
      local_a18[3] = auVar87[7];
      local_a18[4] = auVar87[8];
      local_a18[5] = auVar87[9];
      local_a18[6] = auVar87[10];
      local_a18[7] = auVar87[0xb];
      local_718 = CONCAT17(0,CONCAT16(local_a18[3],
                                      (uint6)CONCAT14(local_a18[2],
                                                      (uint)CONCAT12(local_a18[1],
                                                                     (ushort)local_a18[0]))));
      uVar5 = CONCAT16(local_a18[7],
                       (uint6)CONCAT14(local_a18[6],
                                       (uint)CONCAT12(local_a18[5],(ushort)local_a18[4])));
      uStack_710 = (ulong)uVar5;
      auVar31._8_7_ = uVar5;
      auVar31._0_8_ = local_718;
      auVar31[0xf] = 0;
      auVar30._8_8_ = uStack_9760;
      auVar30._0_8_ = local_9768;
      auVar83 = pmaddwd(auVar31,auVar30);
      local_a48 = 0;
      uStack_a40 = 0;
      local_a38[0] = auVar88[6];
      local_a38[1] = auVar88[7];
      local_a38[2] = auVar88[8];
      local_a38[3] = auVar88[9];
      local_a38[4] = auVar88[10];
      local_a38[5] = auVar88[0xb];
      local_a38[6] = auVar88[0xc];
      local_a38[7] = auVar88[0xd];
      local_738 = CONCAT17(0,CONCAT16(local_a38[3],
                                      (uint6)CONCAT14(local_a38[2],
                                                      (uint)CONCAT12(local_a38[1],
                                                                     (ushort)local_a38[0]))));
      uVar5 = CONCAT16(local_a38[7],
                       (uint6)CONCAT14(local_a38[6],
                                       (uint)CONCAT12(local_a38[5],(ushort)local_a38[4])));
      uStack_730 = (ulong)uVar5;
      auVar29._8_7_ = uVar5;
      auVar29._0_8_ = local_738;
      auVar29[0xf] = 0;
      auVar28._8_8_ = uStack_9750;
      auVar28._0_8_ = local_9758;
      auVar84 = pmaddwd(auVar29,auVar28);
      local_9808 = auVar79._0_8_;
      uStack_9800 = auVar79._8_8_;
      local_9848 = auVar81._0_8_;
      uStack_9840 = auVar81._8_8_;
      local_358 = local_9808;
      uVar72 = local_358;
      uStack_350 = uStack_9800;
      uVar73 = uStack_350;
      local_368 = local_9848;
      uVar70 = local_368;
      uStack_360 = uStack_9840;
      uVar71 = uStack_360;
      local_358._0_4_ = auVar79._0_4_;
      local_358._4_4_ = auVar79._4_4_;
      uStack_350._0_4_ = auVar79._8_4_;
      uStack_350._4_4_ = auVar79._12_4_;
      local_368._0_4_ = auVar81._0_4_;
      local_368._4_4_ = auVar81._4_4_;
      uStack_360._0_4_ = auVar81._8_4_;
      uStack_360._4_4_ = auVar81._12_4_;
      local_398 = (int)local_358 + (int)local_368;
      iStack_394 = local_358._4_4_ + local_368._4_4_;
      iStack_390 = (int)uStack_350 + (int)uStack_360;
      iStack_38c = uStack_350._4_4_ + uStack_360._4_4_;
      local_9828 = auVar80._0_8_;
      uStack_9820 = auVar80._8_8_;
      local_9868 = auVar82._0_8_;
      uStack_9860 = auVar82._8_8_;
      local_378 = local_9828;
      uVar68 = local_378;
      uStack_370 = uStack_9820;
      uVar69 = uStack_370;
      local_388 = local_9868;
      uVar66 = local_388;
      uStack_380 = uStack_9860;
      uVar67 = uStack_380;
      local_378._0_4_ = auVar80._0_4_;
      local_378._4_4_ = auVar80._4_4_;
      uStack_370._0_4_ = auVar80._8_4_;
      uStack_370._4_4_ = auVar80._12_4_;
      local_388._0_4_ = auVar82._0_4_;
      local_388._4_4_ = auVar82._4_4_;
      uStack_380._0_4_ = auVar82._8_4_;
      uStack_380._4_4_ = auVar82._12_4_;
      local_3a8 = (int)local_378 + (int)local_388;
      iStack_3a4 = local_378._4_4_ + local_388._4_4_;
      iStack_3a0 = (int)uStack_370 + (int)uStack_380;
      iStack_39c = uStack_370._4_4_ + uStack_380._4_4_;
      local_9888 = auVar83._0_8_;
      uStack_9880 = auVar83._8_8_;
      local_98a8 = auVar84._0_8_;
      uStack_98a0 = auVar84._8_8_;
      local_3b8 = local_9888;
      uVar64 = local_3b8;
      uStack_3b0 = uStack_9880;
      uVar65 = uStack_3b0;
      local_3c8 = local_98a8;
      uVar62 = local_3c8;
      uStack_3c0 = uStack_98a0;
      uVar63 = uStack_3c0;
      local_3b8._0_4_ = auVar83._0_4_;
      local_3b8._4_4_ = auVar83._4_4_;
      uStack_3b0._0_4_ = auVar83._8_4_;
      uStack_3b0._4_4_ = auVar83._12_4_;
      local_3c8._0_4_ = auVar84._0_4_;
      local_3c8._4_4_ = auVar84._4_4_;
      uStack_3c0._0_4_ = auVar84._8_4_;
      uStack_3c0._4_4_ = auVar84._12_4_;
      local_3d8 = (int)local_3b8 + (int)local_3c8;
      iStack_3d4 = local_3b8._4_4_ + local_3c8._4_4_;
      iStack_3d0 = (int)uStack_3b0 + (int)uStack_3c0;
      iStack_3cc = uStack_3b0._4_4_ + uStack_3c0._4_4_;
      local_3e8 = CONCAT44(iStack_394 + iStack_3a4,local_398 + local_3a8);
      uStack_3e0 = CONCAT44(iStack_38c + iStack_39c,iStack_390 + iStack_3a0);
      local_298 = local_3d8 + local_398 + local_3a8;
      iStack_294 = iStack_3d4 + iStack_394 + iStack_3a4;
      iStack_290 = iStack_3d0 + iStack_390 + iStack_3a0;
      iStack_28c = iStack_3cc + iStack_38c + iStack_39c;
      local_3f8 = CONCAT44(iStack_294,local_298);
      uStack_3f0 = CONCAT44(iStack_28c,iStack_290);
      local_298 = local_298 + local_b6c;
      iStack_294 = iStack_294 + local_b6c;
      iStack_290 = iStack_290 + local_b6c;
      iStack_28c = iStack_28c + local_b6c;
      local_2a8 = local_b28._0_8_;
      uStack_2a0 = 0;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_b28._0_8_;
      local_a68 = 0;
      uStack_a60 = 0;
      local_a58[0] = auVar89[1];
      local_a58[1] = auVar89[2];
      local_a58[2] = auVar89[3];
      local_a58[3] = auVar89[4];
      local_a58[4] = auVar89[5];
      local_a58[5] = auVar89[6];
      local_a58[6] = auVar89[7];
      local_a58[7] = auVar89[8];
      local_758 = CONCAT17(0,CONCAT16(local_a58[3],
                                      (uint6)CONCAT14(local_a58[2],
                                                      (uint)CONCAT12(local_a58[1],
                                                                     (ushort)local_a58[0]))));
      uVar5 = CONCAT16(local_a58[7],
                       (uint6)CONCAT14(local_a58[6],
                                       (uint)CONCAT12(local_a58[5],(ushort)local_a58[4])));
      uStack_750 = (ulong)uVar5;
      auVar27._8_7_ = uVar5;
      auVar27._0_8_ = local_758;
      auVar27[0xf] = 0;
      auVar26._8_8_ = uStack_97a0;
      auVar26._0_8_ = local_97a8;
      auVar79 = pmaddwd(auVar27,auVar26);
      local_a88 = 0;
      uStack_a80 = 0;
      local_a78[0] = auVar90[3];
      local_a78[1] = auVar90[4];
      local_a78[2] = auVar90[5];
      local_a78[3] = auVar90[6];
      local_a78[4] = auVar90[7];
      local_a78[5] = auVar90[8];
      local_a78[6] = auVar90[9];
      local_a78[7] = auVar90[10];
      local_778 = CONCAT17(0,CONCAT16(local_a78[3],
                                      (uint6)CONCAT14(local_a78[2],
                                                      (uint)CONCAT12(local_a78[1],
                                                                     (ushort)local_a78[0]))));
      uVar5 = CONCAT16(local_a78[7],
                       (uint6)CONCAT14(local_a78[6],
                                       (uint)CONCAT12(local_a78[5],(ushort)local_a78[4])));
      uStack_770 = (ulong)uVar5;
      auVar25._8_7_ = uVar5;
      auVar25._0_8_ = local_778;
      auVar25[0xf] = 0;
      auVar24._8_8_ = uStack_9790;
      auVar24._0_8_ = local_9798;
      auVar80 = pmaddwd(auVar25,auVar24);
      local_aa8 = 0;
      uStack_aa0 = 0;
      local_a98[0] = auVar92[1];
      local_a98[1] = auVar92[2];
      local_a98[2] = auVar92[3];
      local_a98[3] = auVar92[4];
      local_a98[4] = auVar92[5];
      local_a98[5] = auVar92[6];
      local_a98[6] = auVar92[7];
      local_a98[7] = auVar92[8];
      local_798 = CONCAT17(0,CONCAT16(local_a98[3],
                                      (uint6)CONCAT14(local_a98[2],
                                                      (uint)CONCAT12(local_a98[1],
                                                                     (ushort)local_a98[0]))));
      uVar5 = CONCAT16(local_a98[7],
                       (uint6)CONCAT14(local_a98[6],
                                       (uint)CONCAT12(local_a98[5],(ushort)local_a98[4])));
      uStack_790 = (ulong)uVar5;
      auVar23._8_7_ = uVar5;
      auVar23._0_8_ = local_798;
      auVar23[0xf] = 0;
      auVar22._8_8_ = uStack_9780;
      auVar22._0_8_ = local_9788;
      auVar81 = pmaddwd(auVar23,auVar22);
      local_ac8 = 0;
      uStack_ac0 = 0;
      local_ab8[0] = auVar6[3];
      local_ab8[1] = auVar6[4];
      local_ab8[2] = auVar6[5];
      local_ab8[3] = auVar6[6];
      local_ab8[4] = auVar6[7];
      local_ab8[5] = auVar6[8];
      local_ab8[6] = auVar6[9];
      local_ab8[7] = auVar6[10];
      local_7b8 = CONCAT17(0,CONCAT16(local_ab8[3],
                                      (uint6)CONCAT14(local_ab8[2],
                                                      (uint)CONCAT12(local_ab8[1],
                                                                     (ushort)local_ab8[0]))));
      uVar5 = CONCAT16(local_ab8[7],
                       (uint6)CONCAT14(local_ab8[6],
                                       (uint)CONCAT12(local_ab8[5],(ushort)local_ab8[4])));
      uStack_7b0 = (ulong)uVar5;
      auVar21._8_7_ = uVar5;
      auVar21._0_8_ = local_7b8;
      auVar21[0xf] = 0;
      auVar20._8_8_ = uStack_9770;
      auVar20._0_8_ = local_9778;
      auVar82 = pmaddwd(auVar21,auVar20);
      local_ae8 = 0;
      uStack_ae0 = 0;
      local_ad8[0] = auVar91[5];
      local_ad8[1] = auVar91[6];
      local_ad8[2] = auVar91[7];
      local_ad8[3] = auVar91[8];
      local_ad8[4] = auVar91[9];
      local_ad8[5] = auVar91[10];
      local_ad8[6] = auVar91[0xb];
      local_ad8[7] = auVar91[0xc];
      local_7d8 = CONCAT17(0,CONCAT16(local_ad8[3],
                                      (uint6)CONCAT14(local_ad8[2],
                                                      (uint)CONCAT12(local_ad8[1],
                                                                     (ushort)local_ad8[0]))));
      uVar5 = CONCAT16(local_ad8[7],
                       (uint6)CONCAT14(local_ad8[6],
                                       (uint)CONCAT12(local_ad8[5],(ushort)local_ad8[4])));
      uStack_7d0 = (ulong)uVar5;
      auVar19._8_7_ = uVar5;
      auVar19._0_8_ = local_7d8;
      auVar19[0xf] = 0;
      auVar18._8_8_ = uStack_9760;
      auVar18._0_8_ = local_9768;
      auVar83 = pmaddwd(auVar19,auVar18);
      local_b08 = 0;
      uStack_b00 = 0;
      local_af8[0] = auVar7[7];
      local_af8[1] = auVar7[8];
      local_af8[2] = auVar7[9];
      local_af8[3] = auVar7[10];
      local_af8[4] = auVar7[0xb];
      local_af8[5] = auVar7[0xc];
      local_af8[6] = auVar7[0xd];
      local_af8[7] = auVar7[0xe];
      local_7f8 = CONCAT17(0,CONCAT16(local_af8[3],
                                      (uint6)CONCAT14(local_af8[2],
                                                      (uint)CONCAT12(local_af8[1],
                                                                     (ushort)local_af8[0]))));
      uVar5 = CONCAT16(local_af8[7],
                       (uint6)CONCAT14(local_af8[6],
                                       (uint)CONCAT12(local_af8[5],(ushort)local_af8[4])));
      uStack_7f0 = (ulong)uVar5;
      auVar17._8_7_ = uVar5;
      auVar17._0_8_ = local_7f8;
      auVar17[0xf] = 0;
      auVar16._8_8_ = uStack_9750;
      auVar16._0_8_ = local_9758;
      auVar84 = pmaddwd(auVar17,auVar16);
      local_98e8 = auVar79._0_8_;
      uStack_98e0 = auVar79._8_8_;
      local_9928 = auVar81._0_8_;
      uStack_9920 = auVar81._8_8_;
      local_418 = local_98e8;
      uVar60 = local_418;
      uStack_410 = uStack_98e0;
      uVar61 = uStack_410;
      local_428 = local_9928;
      uVar58 = local_428;
      uStack_420 = uStack_9920;
      uVar59 = uStack_420;
      local_418._0_4_ = auVar79._0_4_;
      local_418._4_4_ = auVar79._4_4_;
      uStack_410._0_4_ = auVar79._8_4_;
      uStack_410._4_4_ = auVar79._12_4_;
      local_428._0_4_ = auVar81._0_4_;
      local_428._4_4_ = auVar81._4_4_;
      uStack_420._0_4_ = auVar81._8_4_;
      uStack_420._4_4_ = auVar81._12_4_;
      local_458 = (int)local_418 + (int)local_428;
      iStack_454 = local_418._4_4_ + local_428._4_4_;
      iStack_450 = (int)uStack_410 + (int)uStack_420;
      iStack_44c = uStack_410._4_4_ + uStack_420._4_4_;
      local_9908 = auVar80._0_8_;
      uStack_9900 = auVar80._8_8_;
      local_9948 = auVar82._0_8_;
      uStack_9940 = auVar82._8_8_;
      local_438 = local_9908;
      uVar56 = local_438;
      uStack_430 = uStack_9900;
      uVar57 = uStack_430;
      local_448 = local_9948;
      uVar54 = local_448;
      uStack_440 = uStack_9940;
      uVar55 = uStack_440;
      local_438._0_4_ = auVar80._0_4_;
      local_438._4_4_ = auVar80._4_4_;
      uStack_430._0_4_ = auVar80._8_4_;
      uStack_430._4_4_ = auVar80._12_4_;
      local_448._0_4_ = auVar82._0_4_;
      local_448._4_4_ = auVar82._4_4_;
      uStack_440._0_4_ = auVar82._8_4_;
      uStack_440._4_4_ = auVar82._12_4_;
      local_468 = (int)local_438 + (int)local_448;
      iStack_464 = local_438._4_4_ + local_448._4_4_;
      iStack_460 = (int)uStack_430 + (int)uStack_440;
      iStack_45c = uStack_430._4_4_ + uStack_440._4_4_;
      local_9968 = auVar83._0_8_;
      uStack_9960 = auVar83._8_8_;
      local_9988 = auVar84._0_8_;
      uStack_9980 = auVar84._8_8_;
      local_478 = local_9968;
      uVar52 = local_478;
      uStack_470 = uStack_9960;
      uVar53 = uStack_470;
      local_488 = local_9988;
      uVar50 = local_488;
      uStack_480 = uStack_9980;
      uVar51 = uStack_480;
      local_478._0_4_ = auVar83._0_4_;
      local_478._4_4_ = auVar83._4_4_;
      uStack_470._0_4_ = auVar83._8_4_;
      uStack_470._4_4_ = auVar83._12_4_;
      local_488._0_4_ = auVar84._0_4_;
      local_488._4_4_ = auVar84._4_4_;
      uStack_480._0_4_ = auVar84._8_4_;
      uStack_480._4_4_ = auVar84._12_4_;
      local_498 = (int)local_478 + (int)local_488;
      iStack_494 = local_478._4_4_ + local_488._4_4_;
      iStack_490 = (int)uStack_470 + (int)uStack_480;
      iStack_48c = uStack_470._4_4_ + uStack_480._4_4_;
      local_4a8 = CONCAT44(iStack_454 + iStack_464,local_458 + local_468);
      uStack_4a0 = CONCAT44(iStack_44c + iStack_45c,iStack_450 + iStack_460);
      local_2b8 = local_498 + local_458 + local_468;
      iStack_2b4 = iStack_494 + iStack_454 + iStack_464;
      iStack_2b0 = iStack_490 + iStack_450 + iStack_460;
      iStack_2ac = iStack_48c + iStack_44c + iStack_45c;
      local_4b8 = CONCAT44(iStack_2b4,local_2b8);
      uStack_4b0 = CONCAT44(iStack_2ac,iStack_2b0);
      local_2b8 = local_2b8 + local_b6c;
      iStack_2b4 = iStack_2b4 + local_b6c;
      iStack_2b0 = iStack_2b0 + local_b6c;
      iStack_2ac = iStack_2ac + local_b6c;
      local_2c8 = local_b28._0_8_;
      uStack_2c0 = 0;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_b28._0_8_;
      local_258 = CONCAT44(iStack_294 >> auVar45,local_298 >> auVar45);
      uStack_250 = CONCAT44(iStack_28c >> auVar45,iStack_290 >> auVar45);
      local_268 = CONCAT44(iStack_2b4 >> auVar44,local_2b8 >> auVar44);
      uStack_260 = CONCAT44(iStack_2ac >> auVar44,iStack_2b0 >> auVar44);
      auVar49._8_8_ = uStack_250;
      auVar49._0_8_ = local_258;
      auVar48._8_8_ = uStack_260;
      auVar48._0_8_ = local_268;
      auVar79 = packssdw(auVar49,auVar48);
      lVar77 = (long)(local_9714 * in_R8D + local_9718) * 2;
      local_230 = (undefined8 *)((long)local_9708 + lVar77);
      local_99b8 = auVar79._0_8_;
      uStack_99b0 = auVar79._8_8_;
      local_248 = local_99b8;
      uStack_240 = uStack_99b0;
      *local_230 = local_99b8;
      *(undefined8 *)((long)local_9708 + lVar77 + 8) = uStack_99b0;
      local_af8 = auVar7 >> 0x38;
      local_ad8 = auVar91 >> 0x28;
      local_ab8 = auVar6 >> 0x18;
      local_a98 = auVar92 >> 8;
      local_a78 = auVar90 >> 0x18;
      local_a58 = auVar89 >> 8;
      local_a38 = auVar88 >> 0x30;
      local_a18 = auVar87 >> 0x20;
      local_9f8 = auVar86 >> 0x10;
      local_9d8 = uVar4;
      local_9b8 = auVar85 >> 0x10;
      local_998 = uVar3;
      local_4c8 = local_68;
      uStack_4c0 = uStack_60;
      local_488 = uVar50;
      uStack_480 = uVar51;
      local_478 = uVar52;
      uStack_470 = uVar53;
      local_448 = uVar54;
      uStack_440 = uVar55;
      local_438 = uVar56;
      uStack_430 = uVar57;
      local_428 = uVar58;
      uStack_420 = uVar59;
      local_418 = uVar60;
      uStack_410 = uVar61;
      local_408 = local_68;
      uStack_400 = uStack_60;
      local_3c8 = uVar62;
      uStack_3c0 = uVar63;
      local_3b8 = uVar64;
      uStack_3b0 = uVar65;
      local_388 = uVar66;
      uStack_380 = uVar67;
      local_378 = uVar68;
      uStack_370 = uVar69;
      local_368 = uVar70;
      uStack_360 = uVar71;
      local_358 = uVar72;
      uStack_350 = uVar73;
    }
  }
  local_b28 = ZEXT416(local_b0c);
  local_58 = local_b6c;
  local_54 = local_b6c;
  local_50 = local_b6c;
  local_4c = local_b6c;
  prepare_coeffs_12tap
            (auVar93._4_8_,auVar93._0_4_,
             (__m128i *)
             CONCAT17(in_stack_ffffffffffff63e7,
                      CONCAT16(in_stack_ffffffffffff63e6,
                               CONCAT15(in_stack_ffffffffffff63e5,
                                        CONCAT14(in_stack_ffffffffffff63e4,
                                                 CONCAT13(in_stack_ffffffffffff63e3,
                                                          CONCAT12(in_stack_ffffffffffff63e2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffff63e1,
                                                  in_stack_ffffffffffff63e0))))))));
  iVar75 = (1 << (local_9740 & 0x1f)) + ((1 << (*(byte *)(res16[1] + 0x18) & 0x1f)) >> 1);
  local_b48 = CONCAT44(0,*(uint *)(res16[1] + 0x18));
  local_973c = (byte)uVar74;
  iVar78 = 1 << (local_9740 - (char)*(undefined4 *)(res16[1] + 0x18) & 0x1f);
  iVar78 = (((1 << (local_973c & 0x1f)) >> 1) - iVar78) - (iVar78 >> 1);
  local_4 = (undefined2)iVar78;
  uStack_2 = (undefined2)((uint)iVar78 >> 0x10);
  local_b68 = CONCAT44(0,uVar74);
  for (local_9714 = 0; local_9714 < local_bfc; local_9714 = local_9714 + 1) {
    for (local_9718 = 0; local_9718 < local_bf8; local_9718 = local_9718 + 8) {
      lVar76 = (long)(local_9714 * in_R8D + local_9718) * 2;
      puVar1 = (undefined8 *)((long)local_9708 + lVar76);
      uVar3 = *puVar1;
      uVar4 = *(undefined8 *)((long)puVar1 + (long)in_R8D * 2);
      local_178 = (undefined2)uVar3;
      uStack_176 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_174 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_172 = (undefined2)((ulong)uVar3 >> 0x30);
      local_188 = (undefined2)uVar4;
      uStack_186 = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_184 = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_182 = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 2) * 2);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 3) * 2);
      local_198 = (undefined2)uVar3;
      uStack_196 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_194 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_192 = (undefined2)((ulong)uVar3 >> 0x30);
      local_1a8 = (undefined2)uVar4;
      uStack_1a6 = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_1a4 = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_1a2 = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D << 2) * 2);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 5) * 2);
      local_1b8 = (undefined2)uVar3;
      uStack_1b6 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_1b4 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_1b2 = (undefined2)((ulong)uVar3 >> 0x30);
      local_1c8 = (undefined2)uVar4;
      uStack_1c6 = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_1c4 = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_1c2 = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 6) * 2);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 7) * 2);
      local_1d8 = (undefined2)uVar3;
      uStack_1d6 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_1d4 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_1d2 = (undefined2)((ulong)uVar3 >> 0x30);
      local_1e8 = (undefined2)uVar4;
      uStack_1e6 = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_1e4 = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_1e2 = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D << 3) * 2);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 9) * 2);
      local_1f8 = (undefined2)uVar3;
      uStack_1f6 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_1f4 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_1f2 = (undefined2)((ulong)uVar3 >> 0x30);
      local_208 = (undefined2)uVar4;
      uStack_206 = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_204 = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_202 = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 10) * 2);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 0xb) * 2);
      local_218 = (undefined2)uVar3;
      uStack_216 = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_214 = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_212 = (undefined2)((ulong)uVar3 >> 0x30);
      local_228 = (undefined2)uVar4;
      uStack_226 = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_224 = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_222 = (undefined2)((ulong)uVar4 >> 0x30);
      auVar15._2_2_ = local_188;
      auVar15._0_2_ = local_178;
      auVar15._4_2_ = uStack_176;
      auVar15._6_2_ = uStack_186;
      auVar15._10_2_ = uStack_184;
      auVar15._8_2_ = uStack_174;
      auVar15._12_2_ = uStack_172;
      auVar15._14_2_ = uStack_182;
      auVar14._8_8_ = uStack_97a0;
      auVar14._0_8_ = local_97a8;
      auVar85 = pmaddwd(auVar15,auVar14);
      auVar13._2_2_ = local_1a8;
      auVar13._0_2_ = local_198;
      auVar13._4_2_ = uStack_196;
      auVar13._6_2_ = uStack_1a6;
      auVar13._10_2_ = uStack_1a4;
      auVar13._8_2_ = uStack_194;
      auVar13._12_2_ = uStack_192;
      auVar13._14_2_ = uStack_1a2;
      auVar12._8_8_ = uStack_9790;
      auVar12._0_8_ = local_9798;
      auVar86 = pmaddwd(auVar13,auVar12);
      auVar11._2_2_ = local_1c8;
      auVar11._0_2_ = local_1b8;
      auVar11._4_2_ = uStack_1b6;
      auVar11._6_2_ = uStack_1c6;
      auVar11._10_2_ = uStack_1c4;
      auVar11._8_2_ = uStack_1b4;
      auVar11._12_2_ = uStack_1b2;
      auVar11._14_2_ = uStack_1c2;
      auVar10._8_8_ = uStack_9780;
      auVar10._0_8_ = local_9788;
      auVar87 = pmaddwd(auVar11,auVar10);
      auVar9._2_2_ = local_1e8;
      auVar9._0_2_ = local_1d8;
      auVar9._4_2_ = uStack_1d6;
      auVar9._6_2_ = uStack_1e6;
      auVar9._10_2_ = uStack_1e4;
      auVar9._8_2_ = uStack_1d4;
      auVar9._12_2_ = uStack_1d2;
      auVar9._14_2_ = uStack_1e2;
      auVar8._8_8_ = uStack_9770;
      auVar8._0_8_ = local_9778;
      auVar88 = pmaddwd(auVar9,auVar8);
      auVar84._2_2_ = local_208;
      auVar84._0_2_ = local_1f8;
      auVar84._4_2_ = uStack_1f6;
      auVar84._6_2_ = uStack_206;
      auVar84._10_2_ = uStack_204;
      auVar84._8_2_ = uStack_1f4;
      auVar84._12_2_ = uStack_1f2;
      auVar84._14_2_ = uStack_202;
      auVar83._8_8_ = uStack_9760;
      auVar83._0_8_ = local_9768;
      auVar89 = pmaddwd(auVar84,auVar83);
      auVar82._2_2_ = local_228;
      auVar82._0_2_ = local_218;
      auVar82._4_2_ = uStack_216;
      auVar82._6_2_ = uStack_226;
      auVar82._10_2_ = uStack_224;
      auVar82._8_2_ = uStack_214;
      auVar82._12_2_ = uStack_212;
      auVar82._14_2_ = uStack_222;
      auVar81._8_8_ = uStack_9750;
      auVar81._0_8_ = local_9758;
      auVar90 = pmaddwd(auVar82,auVar81);
      local_4d8 = auVar85._0_4_;
      iStack_4d4 = auVar85._4_4_;
      iStack_4d0 = auVar85._8_4_;
      iStack_4cc = auVar85._12_4_;
      local_4e8 = auVar86._0_4_;
      iStack_4e4 = auVar86._4_4_;
      iStack_4e0 = auVar86._8_4_;
      iStack_4dc = auVar86._12_4_;
      local_4f8 = auVar87._0_4_;
      iStack_4f4 = auVar87._4_4_;
      iStack_4f0 = auVar87._8_4_;
      iStack_4ec = auVar87._12_4_;
      local_508 = auVar88._0_4_;
      iStack_504 = auVar88._4_4_;
      iStack_500 = auVar88._8_4_;
      iStack_4fc = auVar88._12_4_;
      local_538 = auVar89._0_4_;
      iStack_534 = auVar89._4_4_;
      iStack_530 = auVar89._8_4_;
      iStack_52c = auVar89._12_4_;
      local_548 = auVar90._0_4_;
      iStack_544 = auVar90._4_4_;
      iStack_540 = auVar90._8_4_;
      iStack_53c = auVar90._12_4_;
      uVar3 = *(undefined8 *)((long)local_9708 + lVar76 + 8);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)in_R8D * 2 + 8);
      uStack_b0 = (undefined2)uVar3;
      uStack_ae = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_ac = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_aa = (undefined2)((ulong)uVar3 >> 0x30);
      uStack_c0 = (undefined2)uVar4;
      uStack_be = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_bc = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_ba = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 2) * 2 + 8);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 3) * 2 + 8);
      uStack_d0 = (undefined2)uVar3;
      uStack_ce = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_cc = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_ca = (undefined2)((ulong)uVar3 >> 0x30);
      uStack_e0 = (undefined2)uVar4;
      uStack_de = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_dc = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_da = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D << 2) * 2 + 8);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 5) * 2 + 8);
      uStack_f0 = (undefined2)uVar3;
      uStack_ee = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_ec = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_ea = (undefined2)((ulong)uVar3 >> 0x30);
      uStack_100 = (undefined2)uVar4;
      uStack_fe = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_fc = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_fa = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 6) * 2 + 8);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 7) * 2 + 8);
      uStack_110 = (undefined2)uVar3;
      uStack_10e = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_10c = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_10a = (undefined2)((ulong)uVar3 >> 0x30);
      uStack_120 = (undefined2)uVar4;
      uStack_11e = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_11c = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_11a = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D << 3) * 2 + 8);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 9) * 2 + 8);
      uStack_130 = (undefined2)uVar3;
      uStack_12e = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_12c = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_12a = (undefined2)((ulong)uVar3 >> 0x30);
      uStack_140 = (undefined2)uVar4;
      uStack_13e = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_13c = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_13a = (undefined2)((ulong)uVar4 >> 0x30);
      uVar3 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 10) * 2 + 8);
      uVar4 = *(undefined8 *)((long)puVar1 + (long)(in_R8D * 0xb) * 2 + 8);
      uStack_150 = (undefined2)uVar3;
      uStack_14e = (undefined2)((ulong)uVar3 >> 0x10);
      uStack_14c = (undefined2)((ulong)uVar3 >> 0x20);
      uStack_14a = (undefined2)((ulong)uVar3 >> 0x30);
      uStack_160 = (undefined2)uVar4;
      uStack_15e = (undefined2)((ulong)uVar4 >> 0x10);
      uStack_15c = (undefined2)((ulong)uVar4 >> 0x20);
      uStack_15a = (undefined2)((ulong)uVar4 >> 0x30);
      auVar80._2_2_ = uStack_c0;
      auVar80._0_2_ = uStack_b0;
      auVar80._4_2_ = uStack_ae;
      auVar80._6_2_ = uStack_be;
      auVar80._10_2_ = uStack_bc;
      auVar80._8_2_ = uStack_ac;
      auVar80._12_2_ = uStack_aa;
      auVar80._14_2_ = uStack_ba;
      auVar79._8_8_ = uStack_97a0;
      auVar79._0_8_ = local_97a8;
      auVar79 = pmaddwd(auVar80,auVar79);
      auVar7._2_2_ = uStack_e0;
      auVar7._0_2_ = uStack_d0;
      auVar7._4_2_ = uStack_ce;
      auVar7._6_2_ = uStack_de;
      auVar7._10_2_ = uStack_dc;
      auVar7._8_2_ = uStack_cc;
      auVar7._12_2_ = uStack_ca;
      auVar7._14_2_ = uStack_da;
      auVar91._8_8_ = uStack_9790;
      auVar91._0_8_ = local_9798;
      auVar91 = pmaddwd(auVar7,auVar91);
      auVar6._2_2_ = uStack_100;
      auVar6._0_2_ = uStack_f0;
      auVar6._4_2_ = uStack_ee;
      auVar6._6_2_ = uStack_fe;
      auVar6._10_2_ = uStack_fc;
      auVar6._8_2_ = uStack_ec;
      auVar6._12_2_ = uStack_ea;
      auVar6._14_2_ = uStack_fa;
      auVar92._8_8_ = uStack_9780;
      auVar92._0_8_ = local_9788;
      auVar92 = pmaddwd(auVar6,auVar92);
      auVar90._2_2_ = uStack_120;
      auVar90._0_2_ = uStack_110;
      auVar90._4_2_ = uStack_10e;
      auVar90._6_2_ = uStack_11e;
      auVar90._10_2_ = uStack_11c;
      auVar90._8_2_ = uStack_10c;
      auVar90._12_2_ = uStack_10a;
      auVar90._14_2_ = uStack_11a;
      auVar89._8_8_ = uStack_9770;
      auVar89._0_8_ = local_9778;
      auVar89 = pmaddwd(auVar90,auVar89);
      auVar88._2_2_ = uStack_140;
      auVar88._0_2_ = uStack_130;
      auVar88._4_2_ = uStack_12e;
      auVar88._6_2_ = uStack_13e;
      auVar88._10_2_ = uStack_13c;
      auVar88._8_2_ = uStack_12c;
      auVar88._12_2_ = uStack_12a;
      auVar88._14_2_ = uStack_13a;
      auVar87._8_8_ = uStack_9760;
      auVar87._0_8_ = local_9768;
      auVar87 = pmaddwd(auVar88,auVar87);
      auVar86._2_2_ = uStack_160;
      auVar86._0_2_ = uStack_150;
      auVar86._4_2_ = uStack_14e;
      auVar86._6_2_ = uStack_15e;
      auVar86._10_2_ = uStack_15c;
      auVar86._8_2_ = uStack_14c;
      auVar86._12_2_ = uStack_14a;
      auVar86._14_2_ = uStack_15a;
      auVar85._8_8_ = uStack_9750;
      auVar85._0_8_ = local_9758;
      auVar85 = pmaddwd(auVar86,auVar85);
      local_578 = auVar79._0_4_;
      iStack_574 = auVar79._4_4_;
      iStack_570 = auVar79._8_4_;
      iStack_56c = auVar79._12_4_;
      local_588 = auVar92._0_4_;
      iStack_584 = auVar92._4_4_;
      iStack_580 = auVar92._8_4_;
      iStack_57c = auVar92._12_4_;
      local_598 = auVar91._0_4_;
      iStack_594 = auVar91._4_4_;
      iStack_590 = auVar91._8_4_;
      iStack_58c = auVar91._12_4_;
      local_5a8 = auVar89._0_4_;
      iStack_5a4 = auVar89._4_4_;
      iStack_5a0 = auVar89._8_4_;
      iStack_59c = auVar89._12_4_;
      local_5d8 = auVar87._0_4_;
      iStack_5d4 = auVar87._4_4_;
      iStack_5d0 = auVar87._8_4_;
      iStack_5cc = auVar87._12_4_;
      local_5e8 = auVar85._0_4_;
      iStack_5e4 = auVar85._4_4_;
      iStack_5e0 = auVar85._8_4_;
      iStack_5dc = auVar85._12_4_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_b48;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_b48;
      iStack_65c = (int)(CONCAT26(uStack_2,CONCAT24(local_4,iVar78)) >> 0x20);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_b68;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_b68;
      auVar47._4_4_ =
           (local_5d8 + local_5e8 + local_578 + local_588 + local_598 + local_5a8 + iVar75 >>
           auVar43) + iVar78 >> auVar41;
      auVar47._0_4_ =
           (local_538 + local_548 + local_4d8 + local_4e8 + local_4f8 + local_508 + iVar75 >>
           auVar43) + iVar78 >> auVar41;
      auVar47._12_4_ =
           (iStack_5d4 + iStack_5e4 + iStack_574 + iStack_584 + iStack_594 + iStack_5a4 + iVar75 >>
           auVar43) + iStack_65c >> auVar41;
      auVar47._8_4_ =
           (iStack_534 + iStack_544 + iStack_4d4 + iStack_4e4 + iStack_4f4 + iStack_504 + iVar75 >>
           auVar43) + iVar78 >> auVar41;
      auVar46._4_4_ =
           (iStack_5d0 + iStack_5e0 + iStack_570 + iStack_580 + iStack_590 + iStack_5a0 + iVar75 >>
           auVar42) + iVar78 >> auVar40;
      auVar46._0_4_ =
           (iStack_530 + iStack_540 + iStack_4d0 + iStack_4e0 + iStack_4f0 + iStack_500 + iVar75 >>
           auVar42) + iVar78 >> auVar40;
      auVar46._12_4_ =
           (iStack_5cc + iStack_5dc + iStack_56c + iStack_57c + iStack_58c + iStack_59c + iVar75 >>
           auVar42) + iStack_65c >> auVar40;
      auVar46._8_4_ =
           (iStack_52c + iStack_53c + iStack_4cc + iStack_4dc + iStack_4ec + iStack_4fc + iVar75 >>
           auVar42) + iVar78 >> auVar40;
      auVar85 = packssdw(auVar47,auVar46);
      local_98 = auVar85._0_2_;
      sStack_96 = auVar85._2_2_;
      sStack_94 = auVar85._4_2_;
      sStack_92 = auVar85._6_2_;
      sStack_90 = auVar85._8_2_;
      sStack_8e = auVar85._10_2_;
      sStack_8c = auVar85._12_2_;
      sStack_8a = auVar85._14_2_;
      *(ulong *)(local_bf0 + (local_9714 * local_bf4 + local_9718)) =
           CONCAT17((0 < sStack_8a) * (sStack_8a < 0x100) * auVar85[0xe] - (0xff < sStack_8a),
                    CONCAT16((0 < sStack_8c) * (sStack_8c < 0x100) * auVar85[0xc] -
                             (0xff < sStack_8c),
                             CONCAT15((0 < sStack_8e) * (sStack_8e < 0x100) * auVar85[10] -
                                      (0xff < sStack_8e),
                                      CONCAT14((0 < sStack_90) * (sStack_90 < 0x100) * auVar85[8] -
                                               (0xff < sStack_90),
                                               CONCAT13((0 < sStack_92) * (sStack_92 < 0x100) *
                                                        auVar85[6] - (0xff < sStack_92),
                                                        CONCAT12((0 < sStack_94) *
                                                                 (sStack_94 < 0x100) * auVar85[4] -
                                                                 (0xff < sStack_94),
                                                                 CONCAT11((0 < sStack_96) *
                                                                          (sStack_96 < 0x100) *
                                                                          auVar85[2] -
                                                                          (0xff < sStack_96),
                                                                          (0 < local_98) *
                                                                          (local_98 < 0x100) *
                                                                          auVar85[0] -
                                                                          (0xff < local_98))))))));
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_12tap_sse2(
    const uint8_t *src, int src_stride, uint8_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params) {
  const int bd = 8;

  DECLARE_ALIGNED(16, int16_t,
                  im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = w;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  const __m128i zero = _mm_setzero_si128();
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;

  assert(conv_params->round_0 > 0);
  __m128i coeffs[6];

  /* Horizontal filter */
  {
    prepare_coeffs_12tap(filter_params_x, subpel_x_qn, coeffs);

    const __m128i round_const = _mm_set1_epi32(
        (1 << (bd + FILTER_BITS - 1)) + ((1 << conv_params->round_0) >> 1));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

    for (i = 0; i < im_h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        const __m128i data_2 =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + (j + 4)]);

        // Filter even-index pixels
        const __m128i src_0 = _mm_unpacklo_epi8(data, zero);
        const __m128i res_0 = _mm_madd_epi16(src_0, coeffs[0]);
        const __m128i src_2 = _mm_unpacklo_epi8(_mm_srli_si128(data, 2), zero);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeffs[1]);
        const __m128i src_4 = _mm_unpacklo_epi8(data_2, zero);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeffs[2]);
        const __m128i src_6 =
            _mm_unpacklo_epi8(_mm_srli_si128(data_2, 2), zero);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeffs[3]);
        const __m128i src_8 =
            _mm_unpacklo_epi8(_mm_srli_si128(data_2, 4), zero);
        const __m128i res_8 = _mm_madd_epi16(src_8, coeffs[4]);
        const __m128i src_10 =
            _mm_unpacklo_epi8(_mm_srli_si128(data_2, 6), zero);
        const __m128i res_10 = _mm_madd_epi16(src_10, coeffs[5]);

        const __m128i res_0246 = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                               _mm_add_epi32(res_2, res_6));
        __m128i res_even =
            _mm_add_epi32(_mm_add_epi32(res_8, res_10), res_0246);
        res_even =
            _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpacklo_epi8(_mm_srli_si128(data, 1), zero);
        const __m128i res_1 = _mm_madd_epi16(src_1, coeffs[0]);
        const __m128i src_3 = _mm_unpacklo_epi8(_mm_srli_si128(data, 3), zero);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeffs[1]);
        const __m128i src_5 =
            _mm_unpacklo_epi8(_mm_srli_si128(data_2, 1), zero);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeffs[2]);
        const __m128i src_7 =
            _mm_unpacklo_epi8(_mm_srli_si128(data_2, 3), zero);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeffs[3]);
        const __m128i src_9 =
            _mm_unpacklo_epi8(_mm_srli_si128(data_2, 5), zero);
        const __m128i res_9 = _mm_madd_epi16(src_9, coeffs[4]);
        const __m128i src_11 =
            _mm_unpacklo_epi8(_mm_srli_si128(data_2, 7), zero);
        const __m128i res_11 = _mm_madd_epi16(src_11, coeffs[5]);

        const __m128i res_1357 = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                               _mm_add_epi32(res_3, res_7));
        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_9, res_11), res_1357);
        res_odd =
            _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        _mm_storeu_si128((__m128i *)&im_block[i * im_stride + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    prepare_coeffs_12tap(filter_params_y, subpel_y_qn, coeffs);

    const __m128i sum_round =
        _mm_set1_epi32((1 << offset_bits) + ((1 << conv_params->round_1) >> 1));
    const __m128i sum_shift = _mm_cvtsi32_si128(conv_params->round_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << bits) >> 1) - (1 << (offset_bits - conv_params->round_1)) -
        ((1 << (offset_bits - conv_params->round_1)) >> 1));
    const __m128i round_shift = _mm_cvtsi32_si128(bits);

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const int16_t *data = &im_block[i * im_stride + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));
        const __m128i src_8 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 8 * im_stride),
                               *(__m128i *)(data + 9 * im_stride));
        const __m128i src_10 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 10 * im_stride),
                               *(__m128i *)(data + 11 * im_stride));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeffs[0]);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeffs[1]);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeffs[2]);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeffs[3]);
        const __m128i res_8 = _mm_madd_epi16(src_8, coeffs[4]);
        const __m128i res_10 = _mm_madd_epi16(src_10, coeffs[5]);

        const __m128i res_0246 = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));
        __m128i res_even =
            _mm_add_epi32(_mm_add_epi32(res_8, res_10), res_0246);

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));
        const __m128i src_9 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 8 * im_stride),
                               *(__m128i *)(data + 9 * im_stride));
        const __m128i src_11 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 10 * im_stride),
                               *(__m128i *)(data + 11 * im_stride));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeffs[0]);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeffs[1]);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeffs[2]);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeffs[3]);
        const __m128i res_9 = _mm_madd_epi16(src_9, coeffs[4]);
        const __m128i res_11 = _mm_madd_epi16(src_11, coeffs[5]);

        const __m128i res_1357 = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                               _mm_add_epi32(res_3, res_7));
        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_9, res_11), res_1357);

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, sum_round), sum_shift);
        __m128i res_hi_round =
            _mm_sra_epi32(_mm_add_epi32(res_hi, sum_round), sum_shift);

        res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                     round_shift);
        res_hi_round = _mm_sra_epi32(_mm_add_epi32(res_hi_round, round_const),
                                     round_shift);

        const __m128i res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
        const __m128i res = _mm_packus_epi16(res16, res16);

        // Accumulate values into the destination buffer
        __m128i *const p = (__m128i *)&dst[i * dst_stride + j];

        _mm_storel_epi64(p, res);
      }
    }
  }
}